

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBarPrivate::tryToShowSizeGrip(QStatusBarPrivate *this)

{
  bool bVar1;
  long in_RDI;
  char *unaff_retaddr;
  QObject *in_stack_00000008;
  bool in_stack_00000053;
  WidgetAttribute in_stack_00000054;
  QWidget *in_stack_00000058;
  ConnectionType c;
  
  if (((*(byte *)(in_RDI + 0x2a0) & 1) != 0) &&
     (*(undefined1 *)(in_RDI + 0x2a0) = 0, *(long *)(in_RDI + 0x298) != 0)) {
    bVar1 = QWidget::isVisible((QWidget *)0x6a5b09);
    c = (ConnectionType)((ulong)in_RDI >> 0x20);
    if (!bVar1) {
      QWidget::setAttribute(in_stack_00000058,in_stack_00000054,in_stack_00000053);
      QMetaObject::invokeMethod<>(in_stack_00000008,unaff_retaddr,c);
      QWidget::setAttribute(in_stack_00000058,in_stack_00000054,in_stack_00000053);
    }
  }
  return;
}

Assistant:

void tryToShowSizeGrip()
    {
        if (!showSizeGrip)
            return;
        showSizeGrip = false;
        if (!resizer || resizer->isVisible())
            return;
        resizer->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
        QMetaObject::invokeMethod(resizer, "_q_showIfNotHidden", Qt::DirectConnection);
        resizer->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
    }